

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

char * fetchUserReservations(int thread_index,User *user)

{
  size_t sVar1;
  query_t *__ptr;
  char *pcVar2;
  char sql_command [1024];
  char acStack_418 [8];
  char acStack_410 [7];
  char acStack_409 [8];
  char acStack_401 [9];
  char acStack_3f8 [8];
  char acStack_3f0 [5];
  undefined8 auStack_3eb [122];
  
  memset(acStack_418,0,0x400);
  sVar1 = strlen(acStack_418);
  *(undefined8 *)((long)auStack_3eb + sVar1) = 0x27203d20726573;
  builtin_strncpy(acStack_418 + sVar1,"SELECT d",8);
  builtin_strncpy(acStack_410 + sVar1,"ate, roo",8);
  builtin_strncpy(acStack_409 + sVar1 + 1,"m, code ",8);
  builtin_strncpy(acStack_401 + sVar1 + 1,"FROM Boo",8);
  builtin_strncpy(acStack_3f8 + sVar1,"kings WH",8);
  builtin_strncpy(acStack_3f0 + sVar1,"ERE user",8);
  strcat(acStack_418,user->username);
  sVar1 = strlen(acStack_418);
  builtin_strncpy(acStack_418 + sVar1,"\' ORDER ",8);
  builtin_strncpy(acStack_410 + sVar1,"BY date_",8);
  builtin_strncpy(acStack_409 + sVar1,"_yyyymmd",8);
  builtin_strncpy(acStack_401 + sVar1,"d, room",8);
  __ptr = queryDatabase(thread_index,0,acStack_418);
  if (__ptr->rv == 0) {
    pcVar2 = (char *)__ptr->query_result;
  }
  else {
    puts("Error querying the database!");
    free(__ptr);
    pcVar2 = "";
  }
  return pcVar2;
}

Assistant:

char* 
fetchUserReservations(int thread_index, User* user)
{
    query_t* query = (query_t*) malloc(sizeof(query_t));
 
    char sql_command[1024];
    memset(sql_command, '\0', sizeof(sql_command));

    strcat(sql_command, "SELECT date, room, code FROM Bookings WHERE user = '");
    strcat(sql_command, user->username);
    #if SORT_VIEW_BY_DATE
        strcat(sql_command, "' ORDER BY date_yyyymmdd, room");
    #else
        strcat(sql_command, "' ORDER BY id");
    #endif
    

    query = queryDatabase(thread_index, 0, sql_command);


    if (query->rv == 0){
        // free(query); // cant free here because it has to be returned... ¯\_(ツ)_/¯
        return (char*) query->query_result;
    }
    else {
        printf("%s\n", "Error querying the database!");

        free(query);
        return "";
    }

}